

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O1

size_t __thiscall
Problem_CGBG_FF::ComputeNumberOfAgentsPresentAtHouse
          (Problem_CGBG_FF *this,Index houseI,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *a_vec)

{
  pointer pSVar1;
  long lVar2;
  pointer puVar3;
  pointer pvVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  
  uVar10 = (ulong)houseI;
  pSVar1 = (this->_m_agentsForHouse_action).super__Vector_base<Scope,_std::allocator<Scope>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((long)(this->_m_agentsForHouse_action).super__Vector_base<Scope,_std::allocator<Scope>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) *
          -0x5555555555555555;
  if (uVar10 <= uVar7 && uVar7 - uVar10 != 0) {
    lVar2 = *(long *)&pSVar1[uVar10].super_SDT.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
    lVar14 = (long)*(pointer *)
                    ((long)&pSVar1[uVar10].super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    + 8) - lVar2;
    if (lVar14 == 0) {
      sVar6 = 0;
    }
    else {
      puVar3 = (a_vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = (long)(a_vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                    .super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
      pvVar4 = (this->_m_houseIndices_action).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->_m_houseIndices_action).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
              -0x5555555555555555;
      uVar11 = 1;
      uVar12 = 0;
      sVar6 = 0;
      do {
        uVar7 = uVar9;
        uVar10 = uVar12;
        if ((uVar9 <= uVar12) ||
           (uVar13 = (ulong)*(uint *)(lVar2 + uVar12 * 4), uVar7 = uVar8, uVar10 = uVar13,
           uVar8 < uVar13 || uVar8 - uVar13 == 0)) goto LAB_0039419f;
        uVar10 = (ulong)puVar3[uVar12];
        lVar5 = *(long *)&pvVar4[uVar13].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data;
        uVar7 = (long)*(pointer *)
                       ((long)&pvVar4[uVar13].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data + 8) - lVar5 >> 2;
        if (uVar7 <= uVar10) goto LAB_0039419f;
        sVar6 = sVar6 + (*(Index *)(lVar5 + uVar10 * 4) == houseI);
        uVar12 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar12 < (ulong)(lVar14 >> 2));
    }
    return sVar6;
  }
LAB_0039419f:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar10,
             uVar7);
}

Assistant:

size_t Problem_CGBG_FF::ComputeNumberOfAgentsPresentAtHouse(Index houseI, const vector<Index>& a_vec) const
{    
    size_t nrAgentsPresent = 0;
    const vector<Index> & tupleOfAgents = _m_agentsForHouse_action.at(houseI);
    for(Index i=0; i < tupleOfAgents.size(); i++)
    {
        Index agI = tupleOfAgents.at(i); //<-agent index
        Index acI = a_vec.at(i);      //<-its action

        const vector<Index>& hs = _m_houseIndices_action.at(agI);
        //cout << "agI="<<agI<<" hs=" << PrintTools::SoftPrintVector(hs)<<endl;
        Index h = hs.at(acI);

        if(h==houseI)
            nrAgentsPresent++;
    }
    //cout << "nrAgentsPresent="<<nrAgentsPresent<<endl;
    return nrAgentsPresent;

}